

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirstWorkingReporter.cpp
# Opt level: O2

bool __thiscall
ApprovalTests::FirstWorkingReporter::report
          (FirstWorkingReporter *this,string *received,string *approved)

{
  pointer psVar1;
  element_type *peVar2;
  pointer psVar3;
  int iVar4;
  pointer psVar5;
  string local_70 [32];
  string local_50 [32];
  
  psVar1 = (this->reporters).
           super__Vector_base<std::shared_ptr<ApprovalTests::Reporter>,_std::allocator<std::shared_ptr<ApprovalTests::Reporter>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  psVar3 = (this->reporters).
           super__Vector_base<std::shared_ptr<ApprovalTests::Reporter>,_std::allocator<std::shared_ptr<ApprovalTests::Reporter>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    psVar5 = psVar3;
    if (psVar5 == psVar1) break;
    peVar2 = (psVar5->super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    ::std::__cxx11::string::string(local_50,(string *)received);
    ::std::__cxx11::string::string(local_70,(string *)approved);
    iVar4 = (*peVar2->_vptr_Reporter[2])(peVar2,local_50,local_70);
    ::std::__cxx11::string::~string(local_70);
    ::std::__cxx11::string::~string(local_50);
    psVar3 = psVar5 + 1;
  } while ((char)iVar4 == '\0');
  return psVar5 != psVar1;
}

Assistant:

bool FirstWorkingReporter::report(std::string received, std::string approved) const
    {
        for (auto& r : reporters)
        {
            if (r->report(received, approved))
            {
                return true;
            }
        }
        return false;
    }